

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O2

bool test_DiskTableNode_behavior(void)

{
  bool bVar1;
  ostream *poVar2;
  long lVar3;
  initializer_list<SSTableDataEntry> __l;
  initializer_list<SSTableDataEntry> __l_00;
  initializer_list<SSTableDataEntry> __l_01;
  DiskTableNode node;
  SSTableDataEntry e;
  DiskTableNode node2;
  DiskTableNode node3;
  undefined1 local_200 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  DiskTableNode node4;
  SSTableData data3;
  SSTableData data2;
  SSTableData data;
  SSTable t;
  SSTableDataEntry local_120;
  SSTableDataEntry local_e0;
  SSTableDataEntry local_a0;
  SSTableDataEntry local_60;
  
  SSTableDataEntry::SSTableDataEntry((SSTableDataEntry *)&t,false,0xbc614e,1,"Hello,World!");
  SSTableDataEntry::SSTableDataEntry(&local_120,false,0x75bc702,2,"LLLLL");
  SSTableDataEntry::SSTableDataEntry(&local_e0,true,0x4840e3f3,3,"");
  SSTableDataEntry::SSTableDataEntry(&local_a0,false,0x75998cb,4,"NIMO");
  SSTableDataEntry::SSTableDataEntry(&local_60,false,0x497ff7f0,10,"Hello,NIMO");
  __l._M_len = 5;
  __l._M_array = (iterator)&t;
  std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>::vector
            (&data,__l,(allocator_type *)&e);
  lVar3 = 0x120;
  do {
    std::__cxx11::string::~string((string *)((long)&t.file._M_pathname._M_dataplus._M_p + lVar3));
    lVar3 = lVar3 + -0x40;
  } while (lVar3 != -0x20);
  SSTableDataEntry::SSTableDataEntry((SSTableDataEntry *)&t,false,0xbc614e,0,"Hello,World!");
  SSTableDataEntry::SSTableDataEntry(&local_120,false,0x75bc702,2,"LLLLL");
  SSTableDataEntry::SSTableDataEntry(&local_e0,true,0x4840e3f3,3,"");
  SSTableDataEntry::SSTableDataEntry(&local_a0,false,0x75998cb,4,"NIMO");
  SSTableDataEntry::SSTableDataEntry(&local_60,false,0x497ff7f0,0xf,"Hello,NIMO");
  __l_00._M_len = 5;
  __l_00._M_array = (iterator)&t;
  std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>::vector
            (&data2,__l_00,(allocator_type *)&e);
  lVar3 = 0x120;
  do {
    std::__cxx11::string::~string((string *)((long)&t.file._M_pathname._M_dataplus._M_p + lVar3));
    lVar3 = lVar3 + -0x40;
  } while (lVar3 != -0x20);
  SSTableDataEntry::SSTableDataEntry((SSTableDataEntry *)&t,false,0x75bc702,2,"LLLLL");
  SSTableDataEntry::SSTableDataEntry(&local_120,true,0x4840e3f3,3,"");
  SSTableDataEntry::SSTableDataEntry(&local_e0,false,0x75998cb,4,"NIMO");
  __l_01._M_len = 3;
  __l_01._M_array = (iterator)&t;
  std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>::vector
            (&data3,__l_01,(allocator_type *)&e);
  lVar3 = 0xa0;
  do {
    std::__cxx11::string::~string((string *)((long)&t.file._M_pathname._M_dataplus._M_p + lVar3));
    lVar3 = lVar3 + -0x40;
  } while (lVar3 != -0x20);
  SSTable::SSTable(&t);
  SSTable::fillData(&t,&data);
  std::filesystem::__cxx11::path::path<char[10],std::filesystem::__cxx11::path>
            ((path *)&e,(char (*) [10])"testf.bin",auto_format);
  SSTable::writeToDisk(&t,(path *)&e);
  std::filesystem::__cxx11::path::~path((path *)&e);
  std::filesystem::__cxx11::path::path<char[10],std::filesystem::__cxx11::path>
            ((path *)&e,(char (*) [10])"testf.bin",auto_format);
  DiskTableNode::DiskTableNode(&node,(path *)&e);
  std::filesystem::__cxx11::path::~path((path *)&e);
  bVar1 = DiskTableNode::mightIn(&node,0xb);
  if (!bVar1) {
    bVar1 = DiskTableNode::mightIn(&node,10);
    if (bVar1) {
      DiskTableNode::mightIn(&node,5);
      poVar2 = std::ostream::_M_insert<bool>(true);
      std::endl<char,std::char_traits<char>>(poVar2);
      DiskTableNode::getEntry(&e,&node,6);
      bVar1 = DiskTableNode::valid(&node,&e);
      if (bVar1) {
LAB_001043a9:
        bVar1 = false;
      }
      else {
        DiskTableNode::getEntry((SSTableDataEntry *)local_200,&node,4);
        SSTableDataEntry::operator=(&e,(SSTableDataEntry *)local_200);
        std::__cxx11::string::~string((string *)(local_200 + 0x20));
        if (e.timestamp != 0x75998cb) goto LAB_001043a9;
        bVar1 = std::operator!=(&e.value,"NIMO");
        if (bVar1) goto LAB_001043a9;
        DiskTableNode::DiskTableNode(&node2);
        DiskTableNode::DiskTableNode(&node3);
        DiskTableNode::fillData(&node2,&data2);
        DiskTableNode::fillData(&node3,&data3);
        bVar1 = DiskTableNode::intersect(&node,&node2);
        if (bVar1) {
          bVar1 = DiskTableNode::intersect(&node,&node3);
          if (!bVar1) goto LAB_0010453e;
          std::filesystem::__cxx11::path::path<char[11],std::filesystem::__cxx11::path>
                    ((path *)local_200,(char (*) [11])"testf2.bin",auto_format);
          DiskTableNode::writeToDisk(&node2,(path *)local_200);
          std::filesystem::__cxx11::path::~path((path *)local_200);
          std::filesystem::__cxx11::path::path<char[11],std::filesystem::__cxx11::path>
                    ((path *)local_200,(char (*) [11])"testf2.bin",auto_format);
          DiskTableNode::DiskTableNode(&node4,(path *)local_200);
          std::filesystem::__cxx11::path::~path((path *)local_200);
          DiskTableNode::getEntry((SSTableDataEntry *)local_200,&node4,4);
          bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)(local_200 + 0x20),"NIMO");
          std::__cxx11::string::~string((string *)(local_200 + 0x20));
          if (!bVar1) {
            remove("testf.bin");
            remove("testf2.bin");
          }
          bVar1 = !bVar1;
          DiskTableNode::~DiskTableNode(&node4);
        }
        else {
LAB_0010453e:
          bVar1 = false;
        }
        DiskTableNode::~DiskTableNode(&node3);
        DiskTableNode::~DiskTableNode(&node2);
      }
      std::__cxx11::string::~string((string *)&e.value);
      goto LAB_001043b9;
    }
  }
  bVar1 = false;
LAB_001043b9:
  DiskTableNode::~DiskTableNode(&node);
  SSTable::~SSTable(&t);
  std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>::~vector(&data3);
  std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>::~vector(&data2);
  std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>::~vector(&data);
  return bVar1;
}

Assistant:

bool test_DiskTableNode_behavior() {
    auto data = SSTableData{
            {false, 12345678,   1,  "Hello,World!"},
            {false, 123455234,  2,  "LLLLL"},
            {true,  1212212211, 3,  ""},
            {false, 123312331,  4,  "NIMO"},
            {false, 1233123312, 10, "Hello,NIMO"}
    };
    auto data2 = SSTableData{
            {false, 12345678,   0,  "Hello,World!"},
            {false, 123455234,  2,  "LLLLL"},
            {true,  1212212211, 3,  ""},
            {false, 123312331,  4,  "NIMO"},
            {false, 1233123312, 15, "Hello,NIMO"}
    };
    auto data3 = SSTableData{
            {false, 123455234,  2, "LLLLL"},
            {true,  1212212211, 3, ""},
            {false, 123312331,  4, "NIMO"},
    };
    auto t = SSTable{};
    t.fillData(std::move(data));
    t.writeToDisk("testf.bin");

    auto node = DiskTableNode{path{"testf.bin"}};

    if (node.mightIn(11)) {
        return false;
    }

    if (!node.mightIn(10)) {
        return false;
    }
    std::cout << node.mightIn(5) << std::endl;

    auto e = node.getEntry(6);

    if (node.valid(e)) {
        return false;
    }

    e = node.getEntry(4);

    if (e.timestamp != 123312331 || e.value != "NIMO") {
        return false;
    }

    auto node2 = DiskTableNode{};
    auto node3 = DiskTableNode{};
    node2.fillData(std::move(data2));
    node3.fillData(std::move(data3));

    if (!node.intersect(node2) || !node.intersect(node3)) {
        return false;
    }

    node2.writeToDisk("testf2.bin");

    auto node4 = DiskTableNode{path{"testf2.bin"}};

    if (node4.getEntry(4).value != "NIMO") {
        return false;
    }

    remove("testf.bin");
    remove("testf2.bin");
    return true;
}